

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.h
# Opt level: O2

void TTD::NSLogEvents::JsRTRawBufferModifyAction_Parse<(TTD::NSLogEvents::EventKind)64>
               (EventLogEntry *evt,ThreadContext *threadContext,FileReader *reader,
               UnlinkableSlabAllocator *alloc)

{
  uint32 uVar1;
  int iVar2;
  JsRTRawBufferModifyAction *pJVar3;
  TTDVar pvVar4;
  uchar *puVar5;
  uint32 i;
  ulong uVar6;
  
  pJVar3 = GetInlineEventDataAs<TTD::NSLogEvents::JsRTRawBufferModifyAction,(TTD::NSLogEvents::EventKind)64>
                     (evt);
  (*reader->_vptr_FileReader[3])(reader,0x12,1);
  puVar5 = (byte *)0x0;
  pvVar4 = NSSnapValues::ParseTTDVar(false,reader);
  pJVar3->Trgt = pvVar4;
  uVar1 = FileReader::ReadUInt32(reader,index,true);
  pJVar3->Index = uVar1;
  uVar1 = FileReader::ReadUInt32(reader,count,true);
  pJVar3->Length = uVar1;
  if (uVar1 != 0) {
    puVar5 = SlabAllocatorBase<8>::SlabAllocateArray<unsigned_char>(alloc,(ulong)uVar1);
  }
  pJVar3->Data = puVar5;
  FileReader::ReadSequenceStart_WDefaultKey(reader,true);
  for (uVar6 = 0; uVar6 < pJVar3->Length; uVar6 = uVar6 + 1) {
    iVar2 = (*reader->_vptr_FileReader[9])(reader,(ulong)(uVar6 != 0));
    pJVar3->Data[uVar6] = (byte)iVar2;
  }
  (*reader->_vptr_FileReader[5])(reader);
  return;
}

Assistant:

void JsRTRawBufferModifyAction_Parse(EventLogEntry* evt, ThreadContext* threadContext, FileReader* reader, UnlinkableSlabAllocator& alloc)
        {
            JsRTRawBufferModifyAction* bufferAction = GetInlineEventDataAs<JsRTRawBufferModifyAction, tag>(evt);

            reader->ReadKey(NSTokens::Key::argRetVal, true);
            bufferAction->Trgt = NSSnapValues::ParseTTDVar(false, reader);

            bufferAction->Index = reader->ReadUInt32(NSTokens::Key::index, true);
            bufferAction->Length = reader->ReadUInt32(NSTokens::Key::count, true);

            bufferAction->Data = (bufferAction->Length != 0) ? alloc.SlabAllocateArray<byte>(bufferAction->Length) : nullptr;

            reader->ReadSequenceStart_WDefaultKey(true);
            for(uint32 i = 0; i < bufferAction->Length; ++i)
            {
                bufferAction->Data[i] = reader->ReadNakedByte(i != 0);
            }
            reader->ReadSequenceEnd();
        }